

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O0

void av1_reset_mbmi(CommonModeInfoParams *mi_params,BLOCK_SIZE sb_size,int mi_row,int mi_col)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int in_ECX;
  int in_EDX;
  byte in_SIL;
  CommonModeInfoParams *in_RDI;
  int alloc_mi_idx;
  int mi_grid_idx;
  int cur_mi_row;
  int mi_rows;
  int sb_size_alloc_mi;
  int mi_alloc_size_1d;
  int sb_size_mi;
  int local_28;
  
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_SIL];
  bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [in_RDI->mi_alloc_bsize];
  bVar3 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_SIL];
  bVar4 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[in_SIL];
  for (local_28 = 0; local_28 < (int)(uint)bVar4; local_28 = local_28 + 1) {
    iVar5 = get_mi_grid_idx(in_RDI,in_EDX + local_28,in_ECX);
    iVar6 = get_alloc_mi_idx(in_RDI,in_EDX + local_28,in_ECX);
    memset(in_RDI->mi_grid_base + iVar5,0,(long)(int)(uint)bVar1 << 3);
    memset(in_RDI->tx_type_map + iVar5,0,(long)(int)(uint)bVar1);
    if (local_28 % (int)(uint)bVar2 == 0) {
      memset(in_RDI->mi_alloc + iVar6,0,
             (long)(int)((ulong)bVar3 / (ulong)(long)(int)(uint)bVar2) * 0xb0);
    }
  }
  return;
}

Assistant:

void av1_reset_mbmi(CommonModeInfoParams *const mi_params, BLOCK_SIZE sb_size,
                    int mi_row, int mi_col) {
  // size of sb in unit of mi (BLOCK_4X4)
  const int sb_size_mi = mi_size_wide[sb_size];
  const int mi_alloc_size_1d = mi_size_wide[mi_params->mi_alloc_bsize];
  // size of sb in unit of allocated mi size
  const int sb_size_alloc_mi = mi_size_wide[sb_size] / mi_alloc_size_1d;
  assert(mi_params->mi_alloc_stride % sb_size_alloc_mi == 0 &&
         "mi is not allocated as a multiple of sb!");
  assert(mi_params->mi_stride % sb_size_mi == 0 &&
         "mi_grid_base is not allocated as a multiple of sb!");

  const int mi_rows = mi_size_high[sb_size];
  for (int cur_mi_row = 0; cur_mi_row < mi_rows; cur_mi_row++) {
    assert(get_mi_grid_idx(mi_params, 0, mi_col + mi_alloc_size_1d) <
           mi_params->mi_stride);
    const int mi_grid_idx =
        get_mi_grid_idx(mi_params, mi_row + cur_mi_row, mi_col);
    const int alloc_mi_idx =
        get_alloc_mi_idx(mi_params, mi_row + cur_mi_row, mi_col);
    memset(&mi_params->mi_grid_base[mi_grid_idx], 0,
           sb_size_mi * sizeof(*mi_params->mi_grid_base));
    memset(&mi_params->tx_type_map[mi_grid_idx], 0,
           sb_size_mi * sizeof(*mi_params->tx_type_map));
    if (cur_mi_row % mi_alloc_size_1d == 0) {
      memset(&mi_params->mi_alloc[alloc_mi_idx], 0,
             sb_size_alloc_mi * sizeof(*mi_params->mi_alloc));
    }
  }
}